

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

string * __thiscall Assimp::FIHexValueImpl::toString_abi_cxx11_(FIHexValueImpl *this)

{
  uint *puVar1;
  byte bVar2;
  long lVar3;
  byte *pbVar4;
  byte *pbVar5;
  ostringstream os;
  long *local_1b8 [2];
  long local_1a8 [2];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  if (this->strValueValid == false) {
    this->strValueValid = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
         *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
    puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
    *puVar1 = *puVar1 | 0x4000;
    lVar3 = *(long *)(local_198[0] + -0x18);
    if (acStack_b8[lVar3 + 1] == '\0') {
      std::ios::widen((char)local_1b8 + (char)lVar3 + ' ');
      acStack_b8[lVar3 + 1] = '\x01';
    }
    acStack_b8[lVar3] = '0';
    pbVar5 = (this->super_FIHexValue).super_FIByteValue.value.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar4 = (this->super_FIHexValue).super_FIByteValue.value.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pbVar5 != pbVar4) {
      do {
        bVar2 = *pbVar5;
        *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
        std::ostream::operator<<(local_198,(uint)bVar2);
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 != pbVar4);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->strValue,(string *)local_1b8);
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
  return &this->strValue;
}

Assistant:

virtual const std::string &toString() const /*override*/ {
        if (!strValueValid) {
            strValueValid = true;
            std::ostringstream os;
            os << std::hex << std::uppercase << std::setfill('0');
            std::for_each(value.begin(), value.end(), [&](uint8_t c) { os << std::setw(2) << static_cast<int>(c); });
            strValue = os.str();
        }
        return strValue;
    }